

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

char * mpack_expect_cstr_alloc(mpack_reader_t *reader,size_t maxsize)

{
  ulong uVar1;
  char *__ptr;
  ulong uVar2;
  size_t length;
  ulong local_10;
  
  __ptr = mpack_expect_cstr_alloc_unchecked(reader,maxsize,&local_10);
  if (__ptr != (char *)0x0) {
    if (local_10 == 0) {
      return __ptr;
    }
    if (*__ptr != '\0') {
      uVar1 = 1;
      do {
        uVar2 = uVar1;
        if (local_10 == uVar2) break;
        uVar1 = uVar2 + 1;
      } while (__ptr[uVar2] != '\0');
      if (local_10 <= uVar2) {
        return __ptr;
      }
    }
    free(__ptr);
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char* mpack_expect_cstr_alloc(mpack_reader_t* reader, size_t maxsize) {
    size_t length;
    char* str = mpack_expect_cstr_alloc_unchecked(reader, maxsize, &length);

    if (str && !mpack_str_check_no_null(str, length)) {
        MPACK_FREE(str);
        mpack_reader_flag_error(reader, mpack_error_type);
        return NULL;
    }

    return str;
}